

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O1

bool __thiscall CSubNet::Match(CSubNet *this,CNetAddr *addr)

{
  Network NVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  CSubNet *pCVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long in_FS_OFFSET;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->valid == true) {
    bVar7 = CNetAddr::IsValid(addr);
    if (!bVar7) goto LAB_006ac097;
    NVar1 = (this->network).m_net;
    if (NVar1 != addr->m_net) goto LAB_006ac097;
    if (NVar1 - NET_ONION < 4) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
        bVar7 = prevector<16U,_unsigned_char,_unsigned_int,_int>::operator==
                          (&addr->m_addr,(prevector<16U,_unsigned_char,_unsigned_int,_int> *)this);
        return bVar7;
      }
      goto LAB_006ac149;
    }
    bVar7 = false;
    if ((NVar1 != NET_UNROUTABLE) && (NVar1 != NET_MAX)) {
      uVar2 = (this->network).m_addr._size;
      uVar5 = uVar2 - 0x11;
      if (uVar2 < 0x11) {
        uVar5 = uVar2;
      }
      uVar3 = (addr->m_addr)._size;
      uVar9 = uVar3 - 0x11;
      if (uVar3 < 0x11) {
        uVar9 = uVar3;
      }
      if (uVar5 != uVar9) {
        __assert_fail("network.m_addr.size() == addr.m_addr.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.cpp"
                      ,0x410,"bool CSubNet::Match(const CNetAddr &) const");
      }
      bVar7 = uVar9 == 0;
      if (!bVar7) {
        if (0x10 < uVar3) {
          addr = (CNetAddr *)(addr->m_addr)._union.indirect_contents.indirect;
        }
        pCVar8 = this;
        if (0x10 < uVar2) {
          pCVar8 = (CSubNet *)(this->network).m_addr._union.indirect_contents.indirect;
        }
        if ((this->netmask[0] & (addr->m_addr)._union.direct[0]) ==
            (pCVar8->network).m_addr._union.direct[0]) {
          lVar10 = 0x100000000;
          lVar6 = 0;
          do {
            lVar11 = lVar6;
            if ((ulong)uVar9 - 1 == lVar11) break;
            lVar12 = lVar10 >> 0x20;
            lVar10 = lVar10 + 0x100000000;
            lVar6 = lVar11 + 1;
          } while ((this->netmask[lVar11 + 1] & (addr->m_addr)._union.direct[lVar12]) ==
                   pCVar8->netmask[lVar12 + -0x20]);
          bVar7 = (ulong)uVar9 <= lVar11 + 1U;
        }
      }
    }
  }
  else {
LAB_006ac097:
    bVar7 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return bVar7;
  }
LAB_006ac149:
  __stack_chk_fail();
}

Assistant:

bool CSubNet::Match(const CNetAddr &addr) const
{
    if (!valid || !addr.IsValid() || network.m_net != addr.m_net)
        return false;

    switch (network.m_net) {
    case NET_IPV4:
    case NET_IPV6:
        break;
    case NET_ONION:
    case NET_I2P:
    case NET_CJDNS:
    case NET_INTERNAL:
        return addr == network;
    case NET_UNROUTABLE:
    case NET_MAX:
        return false;
    }

    assert(network.m_addr.size() == addr.m_addr.size());
    for (size_t x = 0; x < addr.m_addr.size(); ++x) {
        if ((addr.m_addr[x] & netmask[x]) != network.m_addr[x]) {
            return false;
        }
    }
    return true;
}